

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

UVec4 __thiscall tcu::getTextureBorderColorUint(tcu *this,TextureFormat *format,Sampler *sampler)

{
  ChannelType channelType;
  uint uVar1;
  int c;
  TextureSwizzle *pTVar2;
  long lVar3;
  ulong extraout_RDX;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  UVec4 UVar8;
  uint local_48 [4];
  IVec4 channelBits;
  
  channelType = format->type;
  pTVar2 = getBorderColorReadSwizzle(format->order);
  getChannelBitDepth((tcu *)&channelBits,channelType);
  auVar6._0_4_ = (int)(float)(channelBits.m_data[0] * 0x800000 + 0x3f800000);
  auVar6._4_4_ = (int)(float)(channelBits.m_data[1] * 0x800000 + 0x3f800000);
  auVar6._8_4_ = (int)(float)(channelBits.m_data[2] * 0x800000 + 0x3f800000);
  auVar6._12_4_ = (int)(float)(channelBits.m_data[3] * 0x800000 + 0x3f800000);
  auVar7._4_4_ = auVar6._4_4_;
  auVar7._0_4_ = auVar6._4_4_;
  auVar7._8_4_ = auVar6._12_4_;
  auVar7._12_4_ = auVar6._12_4_;
  local_48[0] = (-(uint)((int)(channelBits.m_data[0] ^ 0x80000000U) < -0x7fffffe0) ^ 0xffffffff |
                -auVar6._0_4_ ^ 0xffffffffU) & -(uint)(0 < channelBits.m_data[0]);
  local_48[1] = (-(uint)((int)(channelBits.m_data[1] ^ 0x80000000U) < -0x7fffffe0) ^ 0xffffffff |
                -auVar6._4_4_ ^ 0xffffffffU) & -(uint)(0 < channelBits.m_data[1]);
  local_48[2] = (-(uint)((int)(channelBits.m_data[2] ^ 0x80000000U) < -0x7fffffe0) ^ 0xffffffff |
                (uint)((auVar6._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff) &
                -(uint)(0 < channelBits.m_data[2]);
  local_48[3] = (-(uint)((int)(channelBits.m_data[3] ^ 0x80000000U) < -0x7fffffe0) ^ 0xffffffff |
                (uint)((auVar7._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff) &
                -(uint)(0 < channelBits.m_data[3]);
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  uVar5 = extraout_RDX;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    lVar4 = (long)(int)pTVar2->components[lVar3];
    if (lVar4 == 4) {
      uVar5 = 0;
    }
    else if (pTVar2->components[lVar3] == CHANNEL_ONE) {
      uVar5 = 1;
    }
    else {
      uVar1 = (sampler->borderColor).v.uData[lVar4];
      uVar5 = (ulong)local_48[lVar4];
      if (uVar1 < local_48[lVar4]) {
        uVar5 = (ulong)uVar1;
      }
    }
    *(int *)(this + lVar3 * 4) = (int)uVar5;
  }
  UVar8.m_data[2] = (int)uVar5;
  UVar8.m_data[3] = (int)(uVar5 >> 0x20);
  UVar8.m_data._0_8_ = this;
  return (UVec4)UVar8.m_data;
}

Assistant:

static tcu::UVec4 getTextureBorderColorUint (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const UVec4						valueMax		= getNBitUnsignedIntegerVec4MaxValue(channelBits);
	UVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::min(sampler.borderColor.getAccess<deUint32>()[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}